

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

void armci_msg_sel_scope(int scope,void *x,int n,char *op,int type,int contribute)

{
  int iVar1;
  undefined *puVar2;
  MPI_Datatype poVar3;
  undefined *puVar4;
  ARMCI_Group group;
  MPI_Comm comm;
  MPI_Datatype type_1 [2];
  int block [2];
  undefined8 local_68;
  undefined8 local_60;
  MPI_Comm local_50;
  undefined8 local_48;
  undefined *local_40;
  undefined8 local_38;
  
  ARMCI_Group_get_default((ARMCI_Group *)&local_68);
  local_50 = get_comm((ARMCI_Group *)&local_68);
  if (scope == 0x151) {
    if (_number_of_procs_per_node == 1) {
      local_50 = (MPI_Comm)&ompi_mpi_comm_self;
    }
    else {
      comex_group_comm(ARMCI_Node_group,&local_50);
    }
  }
  if (armci_msg_sel_scope_initialized == '\0') {
    armci_msg_sel_scope_initialized = '\x01';
    local_48 = &ompi_mpi_long_long_int;
    local_40 = &ompi_mpi_int;
    local_68 = 0;
    local_60 = 8;
    local_38 = 0x100000001;
    MPI_Type_create_struct(2);
  }
  iVar1 = strncmp(op,"min",3);
  if (iVar1 == 0) {
    puVar4 = &ompi_mpi_op_minloc;
  }
  else {
    iVar1 = strncmp(op,"max",3);
    if (iVar1 == 0) {
      puVar4 = &ompi_mpi_op_maxloc;
    }
    else {
      comex_error("unsupported armci_msg_sel_scope operation",1);
      puVar4 = &ompi_mpi_op_null;
    }
  }
  if (type < -0x66) {
    if (type != -0x133) {
      if (type != -0x132) {
LAB_00164a6a:
        comex_error("unsupported SELECT operation",1);
        return;
      }
      local_68 = CONCAT44(local_68._4_4_,*x);
      iVar1 = get_default_rank();
      local_68 = CONCAT44(iVar1,(ARMCI_Group)local_68);
      if (scope != 0x151) {
        comex_barrier(ARMCI_Default_Proc_Group);
      }
      puVar2 = &ompi_mpi_float_int;
LAB_00164975:
      MPI_Allreduce(&local_68,&local_48,1,puVar2,puVar4,local_50);
      iVar1 = local_48._4_4_;
      goto LAB_00164a51;
    }
    local_68 = *x;
    iVar1 = get_default_rank();
    local_60 = CONCAT44(local_60._4_4_,iVar1);
    if (scope != 0x151) {
      comex_barrier(ARMCI_Default_Proc_Group);
    }
    poVar3 = (MPI_Datatype)&ompi_mpi_double_int;
  }
  else if (type == -0x66) {
    local_68 = *x;
    iVar1 = get_default_rank();
    local_60 = CONCAT44(local_60._4_4_,iVar1);
    poVar3 = MPI_LONGLONG_INT;
    if (scope != 0x151) {
      comex_barrier(ARMCI_Default_Proc_Group);
      poVar3 = MPI_LONGLONG_INT;
    }
  }
  else {
    if (type != -0x65) {
      if (type != -99) goto LAB_00164a6a;
      local_68 = CONCAT44(local_68._4_4_,*x);
      iVar1 = get_default_rank();
      local_68 = CONCAT44(iVar1,(ARMCI_Group)local_68);
      if (scope != 0x151) {
        comex_barrier(ARMCI_Default_Proc_Group);
      }
      puVar2 = &ompi_mpi_2int;
      goto LAB_00164975;
    }
    local_68 = *x;
    iVar1 = get_default_rank();
    local_60 = CONCAT44(local_60._4_4_,iVar1);
    if (scope != 0x151) {
      comex_barrier(ARMCI_Default_Proc_Group);
    }
    poVar3 = (MPI_Datatype)&ompi_mpi_long_int;
  }
  MPI_Allreduce(&local_68,&local_48,1,poVar3,puVar4,local_50);
  iVar1 = (int)local_40;
LAB_00164a51:
  armci_msg_bcast(x,n,iVar1);
  return;
}

Assistant:

void armci_msg_sel_scope(int scope, void *x, int n, char* op, int type, int contribute)
{
    static int initialized = 0;
    MPI_Op mpi_op = MPI_OP_NULL;
    MPI_Comm comm = get_default_comm();

    if (SCOPE_NODE == scope) {
      if (_number_of_procs_per_node == 1) {
        comm = MPI_COMM_SELF;
      } else {
        comex_group_comm(ARMCI_Node_group,&comm);
      }
    }

    /* first time this function is called we establish the
     * long long w/ int type that MPI doesn't provide by default */
    if (!initialized) {
        int block[2];
        MPI_Aint disp[2];
        MPI_Datatype type[2];

        initialized = 1;
        type[0] = MPI_LONG_LONG;
        type[1] = MPI_INT;
        disp[0] = 0;
        disp[1] = sizeof(long long);
        block[0] = 1;
        block[1] = 1;
#if defined(MPI_VERSION) && (MPI_VERSION >= 2)
        MPI_Type_create_struct(2, block, disp, type, &MPI_LONGLONG_INT);
#else
        MPI_Type_struct(2, block, disp, type, &MPI_LONGLONG_INT);
#endif
    }

    if (strncmp(op, "min", 3) == 0) {
        mpi_op = MPI_MINLOC;
    }
    else if (strncmp(op, "max", 3) == 0) {
        mpi_op = MPI_MAXLOC;
    }
    else {
        comex_error("unsupported armci_msg_sel_scope operation", 1);
    }

#define SELECT(ARMCI_TYPE, C_TYPE, MPI_TYPE)                    \
    if (type == ARMCI_TYPE) {                                   \
        struct {                                                \
            C_TYPE val;                                         \
            int rank;                                           \
        } in, out;                                              \
        in.val = *((C_TYPE*)x);                                 \
        in.rank = get_default_rank();                           \
        if (SCOPE_NODE != scope) {                              \
            comex_barrier(ARMCI_Default_Proc_Group);            \
        }                                                       \
        MPI_Allreduce(&in, &out, 1, MPI_TYPE, mpi_op, comm);    \
        armci_msg_bcast(x, n, out.rank);                        \
    }                                                           \
    else
    SELECT(ARMCI_INT,       int,        MPI_2INT)
    SELECT(ARMCI_LONG,      long,       MPI_LONG_INT)
    SELECT(ARMCI_LONG_LONG, long long,  MPI_LONGLONG_INT)
    SELECT(ARMCI_FLOAT,     float,      MPI_FLOAT_INT)
    SELECT(ARMCI_DOUBLE,    double,     MPI_DOUBLE_INT)
    {
        comex_error("unsupported SELECT operation", 1);
    }
#undef SELECT
}